

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::Parser::_handle_map_blck(Parser *this)

{
  char cVar1;
  pfn_error p_Var2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  Location LVar14;
  csubstr rem;
  csubstr val;
  bool bVar15;
  undefined1 uVar16;
  int iVar17;
  State *pSVar18;
  size_t sVar19;
  uint uVar20;
  char *pcVar21;
  csubstr fmt;
  ro_substr chars;
  ro_substr chars_00;
  ro_substr pattern;
  ro_substr chars_01;
  ro_substr chars_02;
  ro_substr pattern_00;
  ro_substr pattern_01;
  ro_substr pattern_02;
  ro_substr pattern_03;
  ro_substr pattern_04;
  ro_substr pattern_05;
  ro_substr pattern_06;
  ro_substr pattern_07;
  ro_substr pattern_08;
  csubstr cVar22;
  size_t sStackY_270;
  bool is_quoted;
  csubstr local_238;
  char msg [30];
  csubstr s;
  char *pcStack_1d0;
  size_t local_1c8;
  char *pcStack_1a0;
  size_t local_198;
  char *pcStack_178;
  size_t local_170;
  char *pcStack_150;
  size_t local_148;
  char *pcStack_128;
  size_t local_120;
  char *pcStack_100;
  size_t local_f8;
  char *pcStack_d8;
  size_t local_d0;
  char *pcStack_b0;
  size_t local_a8;
  char *pcStack_88;
  size_t local_80;
  char *pcStack_60;
  size_t local_58;
  char *pcStack_38;
  size_t local_30;
  
  pSVar18 = this->m_state;
  local_238.str = (pSVar18->line_contents).rem.str;
  local_238.len = (pSVar18->line_contents).rem.len;
  uVar20 = pSVar18->flags;
  if ((uVar20 & 4) == 0) {
    builtin_strncpy(msg,"check failed: (has_all(RMAP))",0x1e);
    if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar3 = (code *)swi(3);
      uVar16 = (*pcVar3)();
      return (bool)uVar16;
    }
    p_Var2 = (this->m_stack).m_callbacks.m_error;
    cVar22 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_30 = cVar22.len;
    pcStack_38 = cVar22.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x703e) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x703e) << 0x40,8);
    LVar4.name.str = pcStack_38;
    LVar4.name.len = local_30;
    (*p_Var2)(msg,0x1e,LVar4,(this->m_stack).m_callbacks.m_user_data);
    uVar20 = this->m_state->flags;
  }
  if ((uVar20 & 0x10) != 0) {
    builtin_strncpy(msg,"check failed: (has_none(FLOW))",0x1e);
    if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar3 = (code *)swi(3);
      uVar16 = (*pcVar3)();
      return (bool)uVar16;
    }
    p_Var2 = (this->m_stack).m_callbacks.m_error;
    cVar22 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_58 = cVar22.len;
    pcStack_60 = cVar22.str;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x703f) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x703f) << 0x40,8);
    LVar5.name.str = pcStack_60;
    LVar5.name.len = local_58;
    (*p_Var2)(msg,0x1f,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  if ((local_238.len != 0) && (*local_238.str == '#')) {
    _scan_comment(this);
    return true;
  }
  pSVar18 = this->m_state;
  uVar20 = pSVar18->flags;
  if ((uVar20 >> 8 & 1) != 0) {
    if ((uVar20 & 0x40) != 0) {
      builtin_strncpy(msg,"check failed: (has_none(RKEY))",0x1e);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        uVar16 = (*pcVar3)();
        return (bool)uVar16;
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar22 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_80 = cVar22.len;
      pcStack_88 = cVar22.str;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x704a) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x704a) << 0x40,8);
      LVar6.name.str = pcStack_88;
      LVar6.name.len = local_80;
      (*p_Var2)(msg,0x1f,LVar6,(this->m_stack).m_callbacks.m_user_data);
      pSVar18 = this->m_state;
      uVar20 = pSVar18->flags;
    }
    if ((char)uVar20 < '\0') {
      builtin_strncpy(msg,"check failed: (has_none(RVAL))",0x1e);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        uVar16 = (*pcVar3)();
        return (bool)uVar16;
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar22 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_a8 = cVar22.len;
      pcStack_b0 = cVar22.str;
      LVar7.super_LineCol.col = 0;
      LVar7.super_LineCol.offset = SUB168(ZEXT816(0x704b) << 0x40,0);
      LVar7.super_LineCol.line = SUB168(ZEXT816(0x704b) << 0x40,8);
      LVar7.name.str = pcStack_b0;
      LVar7.name.len = local_a8;
      (*p_Var2)(msg,0x1f,LVar7,(this->m_stack).m_callbacks.m_user_data);
      pSVar18 = this->m_state;
      uVar20 = pSVar18->flags;
    }
    pSVar18->flags = uVar20 & 0xfffffebf | 0x40;
  }
  bVar15 = _handle_indentation(this);
  if (bVar15) {
    return true;
  }
  uVar20 = this->m_state->flags;
  if ((uVar20 & 0x40) != 0) {
    if ((uVar20 >> 8 & 1) != 0) {
      builtin_strncpy(msg,"check failed: (has_none(RNXT))",0x1e);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        uVar16 = (*pcVar3)();
        return (bool)uVar16;
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar22 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_d0 = cVar22.len;
      pcStack_d8 = cVar22.str;
      LVar8.super_LineCol.col = 0;
      LVar8.super_LineCol.offset = SUB168(ZEXT816(0x7058) << 0x40,0);
      LVar8.super_LineCol.line = SUB168(ZEXT816(0x7058) << 0x40,8);
      LVar8.name.str = pcStack_d8;
      LVar8.name.len = local_d0;
      (*p_Var2)(msg,0x1f,LVar8,(this->m_stack).m_callbacks.m_user_data);
      uVar20 = this->m_state->flags;
    }
    if ((char)uVar20 < '\0') {
      builtin_strncpy(msg,"check failed: (has_none(RVAL))",0x1e);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        uVar16 = (*pcVar3)();
        return (bool)uVar16;
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar22 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_f8 = cVar22.len;
      pcStack_100 = cVar22.str;
      LVar9.super_LineCol.col = 0;
      LVar9.super_LineCol.offset = SUB168(ZEXT816(0x7059) << 0x40,0);
      LVar9.super_LineCol.line = SUB168(ZEXT816(0x7059) << 0x40,8);
      LVar9.name.str = pcStack_100;
      LVar9.name.len = local_f8;
      (*p_Var2)(msg,0x1f,LVar9,(this->m_stack).m_callbacks.m_user_data);
    }
    bVar15 = _scan_scalar_map_blck(this,&local_238,&is_quoted);
    if (bVar15) {
      if ((~this->m_state->flags & 0x220U) == 0) {
        _append_key_val_null(this,local_238.str + -1);
      }
      cVar22.len = local_238.len;
      cVar22.str = local_238.str;
      _store_scalar(this,cVar22,(uint)is_quoted);
      pSVar18 = this->m_state;
      if ((~pSVar18->flags & 0x820U) == 0) {
        _append_key_val_null(this,local_238.str);
        pSVar18 = this->m_state;
      }
      local_238.str = (pSVar18->line_contents).rem.str;
      local_238.len = (pSVar18->line_contents).rem.len;
      if (local_238.len == 0) {
        return true;
      }
      if (*local_238.str != ':') {
        return true;
      }
      pSVar18->flags = pSVar18->flags & 0xffffff1fU | 0x80;
      _line_progressed(this,1);
      local_238.str = (this->m_state->line_contents).rem.str;
      local_238.len = (this->m_state->line_contents).rem.len;
      chars.len = 2;
      chars.str = " \t";
      bVar15 = basic_substring<const_char>::begins_with_any(&local_238,chars);
      if (!bVar15) {
        return true;
      }
      if ((this->m_state->line_contents).rem.str == (this->m_state->line_contents).full.str) {
        builtin_strncpy(msg,"check failed: (! _at_line_begi",0x1e);
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar3 = (code *)swi(3);
          uVar16 = (*pcVar3)();
          return (bool)uVar16;
        }
        p_Var2 = (this->m_stack).m_callbacks.m_error;
        cVar22 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_120 = cVar22.len;
        pcStack_128 = cVar22.str;
        LVar10.super_LineCol.col = 0;
        LVar10.super_LineCol.offset = SUB168(ZEXT816(0x7075) << 0x40,0);
        LVar10.super_LineCol.line = SUB168(ZEXT816(0x7075) << 0x40,8);
        LVar10.name.str = pcStack_128;
        LVar10.name.len = local_120;
        (*p_Var2)(msg,0x23,LVar10,(this->m_stack).m_callbacks.m_user_data);
      }
      chars_00.len = 2;
      chars_00.str = " \t";
      sVar19 = basic_substring<const_char>::first_not_of(&local_238,chars_00,0);
      if ((sVar19 != 0xffffffffffffffff) && (local_238.len < sVar19)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar3 = (code *)swi(3);
          uVar16 = (*pcVar3)();
          return (bool)uVar16;
        }
        handle_error(0x1e71c6,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1569,"pos <= len || pos == npos");
      }
      if (sVar19 == 0xffffffffffffffff) {
        msg._0_8_ = local_238.str;
        msg._8_6_ = (undefined6)local_238.len;
        msg[0xe] = (char)(local_238.len >> 0x30);
        msg[0xf] = (char)(local_238.len >> 0x38);
      }
      else {
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)msg,local_238.str,sVar19);
      }
      sStackY_270 = CONCAT17(msg[0xf],CONCAT16(msg[0xe],msg._8_6_));
      local_238.str = (char *)msg._0_8_;
      local_238.len = sStackY_270;
      goto LAB_001c3d5b;
    }
    chars_01.len = 2;
    chars_01.str = " \t";
    bVar15 = basic_substring<const_char>::begins_with_any(&local_238,chars_01);
    if (bVar15) {
      chars_02.len = 2;
      chars_02.str = " \t";
      sStackY_270 = basic_substring<const_char>::first_not_of(&local_238,chars_02,0);
      if (sStackY_270 == 0xffffffffffffffff) {
        sStackY_270 = local_238.len;
      }
      goto LAB_001c3d5b;
    }
    iVar17 = basic_substring<const_char>::compare(&local_238,'?');
    if ((iVar17 == 0) ||
       (pattern_01.len = 2, pattern_01.str = "? ",
       bVar15 = basic_substring<const_char>::begins_with(&local_238,pattern_01), bVar15)) {
      pattern_02.len = 2;
      pattern_02.str = "? ";
      bVar15 = basic_substring<const_char>::begins_with(&local_238,pattern_02);
      _line_progressed(this,(ulong)bVar15 + 1);
      pSVar18 = this->m_state;
      uVar20 = pSVar18->flags;
      if ((uVar20 >> 9 & 1) != 0) {
        _append_key_val_null(this,local_238.str + -1);
        pSVar18 = this->m_state;
        uVar20 = pSVar18->flags;
      }
      uVar20 = uVar20 | 0x20;
LAB_001c391a:
      pSVar18->flags = uVar20;
      return true;
    }
    pSVar18 = this->m_state;
    uVar20 = pSVar18->flags;
    if ((((uVar20 & 0x20) != 0) && (local_238.len != 0)) && (*local_238.str == ':')) {
      if ((uVar20 >> 9 & 1) == 0) {
        _store_scalar_null(this,local_238.str);
        pSVar18 = this->m_state;
        uVar20 = pSVar18->flags;
      }
      pSVar18->flags = uVar20 & 0xffffff1f | 0x80;
      _line_progressed(this,1);
      pSVar18 = this->m_state;
      local_238.str = (pSVar18->line_contents).rem.str;
      local_238.len = (pSVar18->line_contents).rem.len;
      if (local_238.len == 0) {
        return true;
      }
      if (*local_238.str != ' ') {
        return true;
      }
      if ((pSVar18->line_contents).rem.str == (pSVar18->line_contents).full.str) {
        builtin_strncpy(msg,"check failed: (! _at_line_begi",0x1e);
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar3 = (code *)swi(3);
          uVar16 = (*pcVar3)();
          return (bool)uVar16;
        }
        p_Var2 = (this->m_stack).m_callbacks.m_error;
        cVar22 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_148 = cVar22.len;
        pcStack_150 = cVar22.str;
        LVar13.super_LineCol.col = 0;
        LVar13.super_LineCol.offset = SUB168(ZEXT816(0x7099) << 0x40,0);
        LVar13.super_LineCol.line = SUB168(ZEXT816(0x7099) << 0x40,8);
        LVar13.name.str = pcStack_150;
        LVar13.name.len = local_148;
        (*p_Var2)(msg,0x23,LVar13,(this->m_stack).m_callbacks.m_user_data);
        pSVar18 = this->m_state;
      }
      if (((pSVar18->line_contents).rem.len == 0) || (*(pSVar18->line_contents).rem.str != ' ')) {
        builtin_strncpy(msg,"check failed: (m_state->line_c",0x1e);
        if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar3 = (code *)swi(3);
          uVar16 = (*pcVar3)();
          return (bool)uVar16;
        }
        p_Var2 = (this->m_stack).m_callbacks.m_error;
        s.str = (char *)0x0;
        s.len = 0x6d66;
        cVar22 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_1c8 = cVar22.len;
        pcStack_1d0 = cVar22.str;
        LVar14.super_LineCol.line = s.len;
        LVar14.super_LineCol.offset = (size_t)s.str;
        LVar14.super_LineCol.col = 0;
        LVar14.name.str = pcStack_1d0;
        LVar14.name.len = local_1c8;
        (*p_Var2)(msg,0x3a,LVar14,(this->m_stack).m_callbacks.m_user_data);
        pSVar18 = this->m_state;
      }
      sStackY_270 = basic_substring<const_char>::first_not_of(&(pSVar18->line_contents).rem,' ',0);
      if (sStackY_270 == 0xffffffffffffffff) {
        sStackY_270 = (this->m_state->line_contents).rem.len;
      }
      goto LAB_001c3d5b;
    }
    iVar17 = basic_substring<const_char>::compare(&local_238,':');
    if (iVar17 != 0) {
      pattern_03.len = 2;
      pattern_03.str = ": ";
      bVar15 = basic_substring<const_char>::begins_with(&local_238,pattern_03);
      if (!bVar15) {
        pattern_07.len = 3;
        pattern_07.str = "...";
        bVar15 = basic_substring<const_char>::begins_with(&local_238,pattern_07);
        if (bVar15) goto LAB_001c3d01;
        pattern_08.len = 3;
        pattern_08.str = "---";
        bVar15 = basic_substring<const_char>::begins_with(&local_238,pattern_08);
        if (bVar15) goto LAB_001c3dcb;
        bVar15 = _handle_types(this);
        if (bVar15) {
          return true;
        }
        bVar15 = _handle_key_anchors_and_refs(this);
        if (bVar15) {
          return true;
        }
        bVar15 = is_debugger_attached();
        if ((bVar15) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar3 = (code *)swi(3);
          uVar16 = (*pcVar3)();
          return (bool)uVar16;
        }
        goto LAB_001c3e12;
      }
      pSVar18 = this->m_state;
      uVar20 = pSVar18->flags;
    }
    if ((uVar20 >> 9 & 1) == 0) {
      _store_scalar_null(this,local_238.str);
      pSVar18 = this->m_state;
      uVar20 = pSVar18->flags & 0xffffffdf;
      pSVar18->flags = uVar20;
    }
    pSVar18->flags = uVar20 & 0xffffff3f | 0x80;
    iVar17 = basic_substring<const_char>::compare(&local_238,':');
    sStackY_270 = 2 - (ulong)(iVar17 == 0);
    goto LAB_001c3d5b;
  }
  if (-1 < (char)uVar20) {
    bVar15 = is_debugger_attached();
    if ((bVar15) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar3 = (code *)swi(3);
      uVar16 = (*pcVar3)();
      return (bool)uVar16;
    }
    pcVar21 = "ERROR: internal error";
    sStackY_270 = 0x15;
    goto LAB_001c3148;
  }
  if ((uVar20 >> 8 & 1) != 0) {
    builtin_strncpy(msg,"check failed: (has_none(RNXT))",0x1e);
    if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar3 = (code *)swi(3);
      uVar16 = (*pcVar3)();
      return (bool)uVar16;
    }
    p_Var2 = (this->m_stack).m_callbacks.m_error;
    cVar22 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_170 = cVar22.len;
    pcStack_178 = cVar22.str;
    LVar11.super_LineCol.col = 0;
    LVar11.super_LineCol.offset = SUB168(ZEXT816(0x70c7) << 0x40,0);
    LVar11.super_LineCol.line = SUB168(ZEXT816(0x70c7) << 0x40,8);
    LVar11.name.str = pcStack_178;
    LVar11.name.len = local_170;
    (*p_Var2)(msg,0x1f,LVar11,(this->m_stack).m_callbacks.m_user_data);
    if ((this->m_state->flags & 0x40) != 0) {
      builtin_strncpy(msg,"check failed: (has_none(RKEY))",0x1e);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        uVar16 = (*pcVar3)();
        return (bool)uVar16;
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar22 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_198 = cVar22.len;
      pcStack_1a0 = cVar22.str;
      LVar12.super_LineCol.col = 0;
      LVar12.super_LineCol.offset = SUB168(ZEXT816(0x70c8) << 0x40,0);
      LVar12.super_LineCol.line = SUB168(ZEXT816(0x70c8) << 0x40,8);
      LVar12.name.str = pcStack_1a0;
      LVar12.name.len = local_198;
      (*p_Var2)(msg,0x1f,LVar12,(this->m_stack).m_callbacks.m_user_data);
    }
  }
  s.str = (char *)0x0;
  s.len = 0;
  bVar15 = _scan_scalar_map_blck(this,&s,&is_quoted);
  if (bVar15) {
    local_238.str = (this->m_state->line_contents).rem.str;
    local_238.len = (this->m_state->line_contents).rem.len;
    pattern.len = 2;
    pattern.str = ": ";
    bVar15 = basic_substring<const_char>::begins_with(&local_238,pattern);
    if (!bVar15) {
      if ((local_238.len == 0) || (*local_238.str != ':')) {
        val.len = s.len;
        val.str = s.str;
        _append_key_val(this,val,(uint)is_quoted);
        pSVar18 = this->m_state;
        uVar20 = pSVar18->flags & 0xffffff3fU | 0x40;
        goto LAB_001c391a;
      }
      this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
      _push_level(this,false);
      _move_scalar_from_top(this);
      _move_val_anchor_to_key_anchor(this);
      _start_map(this,true);
      _save_indentation(this,s.len);
      this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x80;
LAB_001c3d55:
      sStackY_270 = 1;
      goto LAB_001c3d5b;
    }
    this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
    _push_level(this,false);
    _move_scalar_from_top(this);
    _move_val_anchor_to_key_anchor(this);
    _start_map(this,true);
    _save_indentation(this,this->m_state->scalar_col);
    this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x80;
  }
  else {
    pattern_00.len = 2;
    pattern_00.str = "- ";
    bVar15 = basic_substring<const_char>::begins_with(&local_238,pattern_00);
    if (!bVar15) {
      iVar17 = basic_substring<const_char>::compare(&local_238,'-');
      if (iVar17 == 0) {
        _start_unk(this,false);
        _save_indentation(this,0);
      }
      else {
        if (local_238.len == 0) {
LAB_001c3c19:
          bVar15 = _handle_types(this);
          if (bVar15) {
            return true;
          }
          bVar15 = _handle_val_anchors_and_refs(this);
          if (bVar15) {
            return true;
          }
          pattern_04.len = 4;
          pattern_04.str = "--- ";
          bVar15 = basic_substring<const_char>::begins_with(&local_238,pattern_04);
          if (((bVar15) ||
              (iVar17 = basic_substring<const_char>::compare(&local_238,"---",3), iVar17 == 0)) ||
             (pattern_05.len = 4, pattern_05.str = "---\t",
             bVar15 = basic_substring<const_char>::begins_with(&local_238,pattern_05), bVar15)) {
LAB_001c3dcb:
            rem.len = local_238.len;
            rem.str = local_238.str;
            _start_new_doc(this,rem);
            return true;
          }
          pattern_06.len = 3;
          pattern_06.str = "...";
          bVar15 = basic_substring<const_char>::begins_with(&local_238,pattern_06);
          if (bVar15) {
LAB_001c3d01:
            _end_stream(this);
            sStackY_270 = 3;
            goto LAB_001c3d5b;
          }
          bVar15 = is_debugger_attached();
          if ((bVar15) && (bVar15 = is_debugger_attached(), bVar15)) {
            pcVar3 = (code *)swi(3);
            uVar16 = (*pcVar3)();
            return (bool)uVar16;
          }
LAB_001c3e12:
          pcVar21 = "ERROR: parse error";
          sStackY_270 = 0x12;
LAB_001c3148:
          fmt.len = sStackY_270;
          fmt.str = pcVar21;
          _err<>(this,fmt);
          return false;
        }
        cVar1 = *local_238.str;
        if (cVar1 == ' ') {
          sVar19 = basic_substring<const_char>::first_not_of(&local_238,' ',0);
          if ((sVar19 != 0xffffffffffffffff) && (local_238.len < sVar19)) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
              pcVar3 = (code *)swi(3);
              uVar16 = (*pcVar3)();
              return (bool)uVar16;
            }
            handle_error(0x1e71c6,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1569,"pos <= len || pos == npos");
          }
          if (sVar19 == 0xffffffffffffffff) {
            msg._0_8_ = local_238.str;
            msg._8_6_ = (undefined6)local_238.len;
            msg[0xe] = (char)(local_238.len >> 0x30);
            msg[0xf] = (char)(local_238.len >> 0x38);
          }
          else {
            basic_substring<const_char>::basic_substring
                      ((basic_substring<const_char> *)msg,local_238.str,sVar19);
          }
          sStackY_270 = CONCAT17(msg[0xf],CONCAT16(msg[0xe],msg._8_6_));
          goto LAB_001c3d5b;
        }
        if (cVar1 == '{') {
          this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
          _push_level(this,true);
          _move_scalar_from_top(this);
          _start_map(this,true);
          this->m_state->flags = this->m_state->flags & 0xffffff2fU | 0x50;
        }
        else {
          if (cVar1 != '[') goto LAB_001c3c19;
          this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
          _push_level(this,true);
          _move_scalar_from_top(this);
          _start_seq(this,true);
          this->m_state->flags = this->m_state->flags | 0x10;
        }
      }
      goto LAB_001c3d55;
    }
    this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
    _push_level(this,false);
    _move_scalar_from_top(this);
    _start_seq(this,true);
    _save_indentation(this,0);
  }
  sStackY_270 = 2;
LAB_001c3d5b:
  _line_progressed(this,sStackY_270);
  return true;
}

Assistant:

bool Parser::_handle_map_blck()
{
    _c4dbgpf("handle_map_blck: node_id={}  level={}", m_state->node_id, m_state->level);
    csubstr rem = m_state->line_contents.rem;

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RMAP));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(FLOW));

    if(rem.begins_with('#'))
    {
        _c4dbgp("it's a comment");
        rem = _scan_comment();
        return true;
    }

    if(has_any(RNXT))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));
        // actually, we don't need RNXT in indent-based maps.
        addrem_flags(RKEY, RNXT);
    }

    if(_handle_indentation())
    {
        _c4dbgp("indentation token");
        return true;
    }

    if(has_any(RKEY))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));

        _c4dbgp("RMAP|RKEY read scalar?");
        bool is_quoted;
        if(_scan_scalar_map_blck(&rem, &is_quoted)) // this also progresses the line
        {
            _c4dbgpf("it's a{} scalar", is_quoted ? " quoted" : "");
            if(has_all(QMRK|SSCL))
            {
                _c4dbgpf("current key is QMRK; SSCL is set. so take store scalar='{}' as key and add an empty val", m_state->scalar);
                _append_key_val_null(rem.str - 1);
            }
            _store_scalar(rem, is_quoted);
            if(has_all(QMRK|RSET))
            {
                _c4dbgp("it's a complex key, so use null value '~'");
                _append_key_val_null(rem.str);
            }
            rem = m_state->line_contents.rem;

            if(rem.begins_with(':'))
            {
                _c4dbgp("wait for val");
                addrem_flags(RVAL, RKEY|QMRK);
                _line_progressed(1);
                rem = m_state->line_contents.rem;
                if(rem.begins_with_any(" \t"))
                {
                    _RYML_CB_ASSERT(m_stack.m_callbacks,  ! _at_line_begin());
                    rem = rem.left_of(rem.first_not_of(" \t"));
                    _c4dbgpf("skip {} spaces/tabs", rem.len);
                    _line_progressed(rem.len);
                }
            }
            return true;
        }
        else if(rem.begins_with_any(" \t"))
        {
            size_t pos = rem.first_not_of(" \t");
            if(pos == npos)
                pos = rem.len;
            _c4dbgpf("skip {} spaces/tabs", pos);
            _line_progressed(pos);
            return true;
        }
        else if(rem == '?' || rem.begins_with("? "))
        {
            _c4dbgp("it's a complex key");
            _line_progressed(rem.begins_with("? ") ? 2u : 1u);
            if(has_any(SSCL))
                _append_key_val_null(rem.str - 1);
            add_flags(QMRK);
            return true;
        }
        else if(has_all(QMRK) && rem.begins_with(':'))
        {
            _c4dbgp("complex key finished");
            if(!has_any(SSCL))
                _store_scalar_null(rem.str);
            addrem_flags(RVAL, RKEY|QMRK);
            _line_progressed(1);
            rem = m_state->line_contents.rem;
            if(rem.begins_with(' '))
            {
                _RYML_CB_ASSERT(m_stack.m_callbacks,  ! _at_line_begin());
                _skipchars(' ');
            }
            return true;
        }
        else if(rem == ':' || rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgp("key finished");
            if(!has_all(SSCL))
            {
                _c4dbgp("key was empty...");
                _store_scalar_null(rem.str);
                rem_flags(QMRK);
            }
            addrem_flags(RVAL, RKEY);
            _line_progressed(rem == ':' ? 1 : 2);
            return true;
        }
        else if(rem.begins_with("..."))
        {
            _c4dbgp("end current document");
            _end_stream();
            _line_progressed(3);
            return true;
        }
        else if(rem.begins_with("---"))
        {
            _c4dbgp("start new document '---'");
            _start_new_doc(rem);
            return true;
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_key_anchors_and_refs())
        {
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else if(has_any(RVAL))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));

        _c4dbgp("RMAP|RVAL read scalar?");
        csubstr s;
        bool is_quoted;
        if(_scan_scalar_map_blck(&s, &is_quoted)) // this also progresses the line
        {
            _c4dbgpf("it's a{} scalar", is_quoted ? " quoted" : "");

            rem = m_state->line_contents.rem;

            if(rem.begins_with(": "))
            {
                _c4dbgp("actually, the scalar is the first key of a map");
                addrem_flags(RKEY, RVAL); // before _push_level! This prepares the current level for popping by setting it to RNXT
                _push_level();
                _move_scalar_from_top();
                _move_val_anchor_to_key_anchor();
                _start_map();
                _save_indentation(m_state->scalar_col);
                addrem_flags(RVAL, RKEY);
                _line_progressed(2);
            }
            else if(rem.begins_with(':'))
            {
                _c4dbgp("actually, the scalar is the first key of a map, and it opens a new scope");
                addrem_flags(RKEY, RVAL); // before _push_level! This prepares the current level for popping by setting it to RNXT
                _push_level();
                _move_scalar_from_top();
                _move_val_anchor_to_key_anchor();
                _start_map();
                _save_indentation(/*behind*/s.len);
                addrem_flags(RVAL, RKEY);
                _line_progressed(1);
            }
            else
            {
                _c4dbgp("appending keyval to current map");
                _append_key_val(s, is_quoted);
                addrem_flags(RKEY, RVAL);
            }
            return true;
        }
        else if(rem.begins_with("- ") _RYML_WITH_TAB_TOKENS( || rem.begins_with("-\t")))
        {
            _c4dbgp("val is a nested seq, indented");
            addrem_flags(RKEY, RVAL); // before _push_level!
            _push_level();
            _move_scalar_from_top();
            _start_seq();
            _save_indentation();
            _line_progressed(2);
            return true;
        }
        else if(rem == '-')
        {
            _c4dbgp("maybe a seq. start unknown, indented");
            _start_unk();
            _save_indentation();
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('['))
        {
            _c4dbgp("val is a child seq, flow");
            addrem_flags(RKEY, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _move_scalar_from_top();
            _start_seq();
            add_flags(FLOW);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('{'))
        {
            _c4dbgp("val is a child map, flow");
            addrem_flags(RKEY, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _move_scalar_from_top();
            _start_map();
            addrem_flags(FLOW|RKEY, RVAL);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with(' '))
        {
            csubstr spc = rem.left_of(rem.first_not_of(' '));
            if(_at_line_begin())
            {
                _c4dbgpf("skipping value indentation: {} spaces", spc.len);
                _line_progressed(spc.len);
                return true;
            }
            else
            {
                _c4dbgpf("skipping {} spaces", spc.len);
                _line_progressed(spc.len);
                return true;
            }
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_val_anchors_and_refs())
        {
            return true;
        }
        else if(rem.begins_with("--- ") || rem == "---" || rem.begins_with("---\t"))
        {
            _start_new_doc(rem);
            return true;
        }
        else if(rem.begins_with("..."))
        {
            _c4dbgp("end current document");
            _end_stream();
            _line_progressed(3);
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else
    {
        _c4err("internal error");
    }

    return false;
}